

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

BOOL UTIL_IsExecuteBitsSet(stat *stat_data)

{
  __uid_t _Var1;
  __gid_t _Var2;
  __uid_t _Var3;
  __gid_t _Var4;
  bool bVar5;
  uint local_1c;
  BOOL bRetVal;
  stat *stat_data_local;
  
  if ((stat_data->st_mode & 0xf000) == 0x4000) {
    stat_data_local._4_4_ = 0;
  }
  else {
    _Var1 = stat_data->st_uid;
    _Var3 = geteuid();
    if (_Var1 == _Var3) {
      bVar5 = (stat_data->st_mode & 0x40) != 0;
    }
    else {
      _Var2 = stat_data->st_gid;
      _Var4 = getegid();
      if (_Var2 == _Var4) {
        bVar5 = (stat_data->st_mode & 8) != 0;
      }
      else {
        bVar5 = (stat_data->st_mode & 1) != 0;
      }
    }
    local_1c = (uint)bVar5;
    stat_data_local._4_4_ = local_1c;
  }
  return stat_data_local._4_4_;
}

Assistant:

BOOL UTIL_IsExecuteBitsSet( struct stat * stat_data )
{
    BOOL bRetVal = FALSE;

    if ( (stat_data->st_mode & S_IFMT) == S_IFDIR )
    {
        return FALSE;
    }
    
    /* Check for read permissions. */
    if ( stat_data->st_uid == geteuid() )
    {
        /* The process owner is the file owner as well. */
        if ( ( stat_data->st_mode & S_IXUSR ) )
        {
            bRetVal = TRUE;
        }
    }
    else if ( stat_data->st_gid == getegid() )
    {
        /* The process's owner is in the same group as the file's owner. */
        if ( ( stat_data->st_mode & S_IXGRP ) )
        {
            bRetVal = TRUE;
        }
    }
    else
    {
        /* Check the other bits to see who can access the file. */
        if ( ( stat_data->st_mode & S_IXOTH ) )
        {
            bRetVal = TRUE;
        }
    }

    return bRetVal;
}